

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCDecoder.cpp
# Opt level: O1

void ZXing::MaxiCode::DecodedBitStreamParser::GetMessage
               (ByteArray *bytes,int start,int len,Content *result,StructuredAppendInfo *sai)

{
  byte bVar1;
  short sVar2;
  pointer puVar3;
  uint uVar4;
  uint uVar5;
  ECI EVar6;
  uint uVar7;
  long lVar8;
  ECI EVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  string local_58;
  StructuredAppendInfo *local_38;
  long lVar9;
  
  if (0 < len) {
    iVar13 = -1;
    iVar15 = 0;
    iVar14 = 0;
    iVar12 = start;
    local_38 = sai;
    do {
      puVar3 = (bytes->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = (ulong)puVar3[iVar12];
      if (0x3f < uVar11) {
        std::__throw_out_of_range_fmt
                  ("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar11,0x40);
      }
      sVar2 = *(short *)(CHARSETS + uVar11 * 2 + (long)iVar15 * 0x80);
      iVar16 = iVar15;
      switch(sVar2) {
      case 0x100:
      case 0x101:
      case 0x102:
      case 0x103:
      case 0x104:
        iVar13 = 1;
        iVar16 = sVar2 + -0x100;
        iVar14 = iVar15;
        break;
      case 0x105:
        iVar13 = 2;
        goto LAB_0015b2f4;
      case 0x106:
        iVar13 = 3;
LAB_0015b2f4:
        iVar16 = 0;
        iVar14 = iVar15;
        break;
      case 0x107:
        iVar15 = 0;
      case 0x109:
switchD_0015b24b_caseD_109:
        iVar13 = -1;
        iVar16 = iVar15;
        break;
      case 0x108:
        iVar15 = 1;
        goto switchD_0015b24b_caseD_109;
      case 0x10a:
        bVar1 = puVar3[(long)iVar12 + 1];
        EVar10 = (ECI)bVar1;
        if ((bVar1 & 0x20) == 0) {
          iVar12 = iVar12 + 1;
        }
        else {
          EVar6 = (ECI)puVar3[(long)iVar12 + 2];
          uVar7 = (uint)bVar1;
          if ((bVar1 & 0x10) == 0) {
            iVar15 = 2;
            EVar10 = (uVar7 & 0xf) << 6;
          }
          else {
            lVar8 = (long)iVar12;
            if ((bVar1 & 8) != 0) {
              lVar9 = (long)iVar12;
              iVar12 = iVar12 + 4;
              EVar10 = (uint)puVar3[lVar8 + 3] << 6 | EVar6 << 0xc | (uVar7 & 3) << 0x12 |
                       (uint)puVar3[lVar9 + 4];
              goto LAB_0015b3b5;
            }
            iVar15 = 3;
            EVar10 = (uVar7 & 7) << 0xc;
            EVar6 = EVar6 << 6 | (uint)puVar3[lVar8 + 3];
          }
          iVar12 = iVar12 + iVar15;
          EVar10 = EVar10 | EVar6;
        }
LAB_0015b3b5:
        Content::switchEncoding(result,EVar10,true);
        break;
      case 0x10b:
        ToString<int,void>(&local_58,
                           (ZXing *)(ulong)((uint)puVar3[(long)iVar12 + 5] +
                                           (uint)puVar3[(long)iVar12 + 4] * 0x40 +
                                           (uint)puVar3[(long)iVar12 + 3] * 0x1000 +
                                           (uint)puVar3[(long)iVar12 + 2] * 0x40000 +
                                           (uint)puVar3[(long)iVar12 + 1] * 0x1000000),9,
                           (uint)puVar3[(long)iVar12 + 3] * 0x1000);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)result,
                   (result->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_58._M_dataplus._M_p,
                   local_58._M_dataplus._M_p + local_58._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        iVar12 = iVar12 + 5;
        break;
      case 0x10c:
        if (iVar12 == start) {
          bVar1 = puVar3[(long)iVar12 + 1];
          iVar12 = iVar12 + 1;
          uVar5 = bVar1 >> 3 & 7;
          uVar4 = bVar1 & 7;
          uVar7 = uVar4 + 1;
          if (uVar4 < uVar5) {
            uVar7 = 0;
          }
          if ((bVar1 & 7) == 0) {
            uVar7 = uVar4;
          }
          local_38->index = uVar5;
          local_38->count = uVar7;
        }
        goto switchD_0015b24b_caseD_109;
      default:
        Content::push_back(result,(uint8_t)sVar2);
      }
      bVar17 = iVar13 == 0;
      iVar13 = iVar13 + -1;
      iVar15 = iVar16;
      if (bVar17) {
        iVar15 = iVar14;
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < len + start);
  }
  return;
}

Assistant:

static void GetMessage(const ByteArray& bytes, int start, int len, Content& result, StructuredAppendInfo& sai)
{
	int shift = -1;
	int set = 0;
	int lastset = 0;

	for (int i = start; i < start + len; i++) {
		int c = CHARSETS[set].at(bytes[i]);
		switch (c) {
		case LCHA:
			set   = 0;
			shift = -1;
			break;
		case LCHB:
			set   = 1;
			shift = -1;
			break;
		case SHI0:
		case SHI1:
		case SHI2:
		case SHI3:
		case SHI4:
			lastset = set;
			set     = c - SHI0;
			shift   = 1;
			break;
		case TWSA:
			lastset = set;
			set     = 0;
			shift   = 2;
			break;
		case TRSA:
			lastset = set;
			set     = 0;
			shift   = 3;
			break;
		case NS:
			result.append(
				ToString((bytes[i + 1] << 24) + (bytes[i + 2] << 18) + (bytes[i + 3] << 12) + (bytes[i + 4] << 6) + bytes[i + 5], 9));
			i += 5;
			break;
		case LOCK: shift = -1; break;
		case ECI: result.switchEncoding(ParseECIValue(bytes, i)); break;
		case PAD:
			if (i == start)
				ParseStructuredAppend(bytes, i, sai);
			shift = -1;
			break;
		default: result.push_back(c);
		}

		if (shift-- == 0)
			set = lastset;
	}
}